

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_dc_left_predictor_64x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  uint8_t *in_RCX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar2 [16];
  __m128i row;
  __m128i sixteen;
  __m128i sum_left;
  longlong local_f8;
  longlong lStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  ptrdiff_t local_b8;
  uint8_t *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  undefined2 local_7e;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  longlong local_48;
  undefined8 uStack_40;
  longlong local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_b8 = in_RSI;
  local_b0 = in_RDI;
  dc_sum_32_sse2(in_RCX);
  local_7e = 0x10;
  local_2 = 0x10;
  local_4 = 0x10;
  local_6 = 0x10;
  local_8 = 0x10;
  local_a = 0x10;
  local_c = 0x10;
  local_e = 0x10;
  local_10 = 0x10;
  local_e8 = 0x10001000100010;
  uStack_e0 = 0x10001000100010;
  local_98 = (short)extraout_XMM0_Qa;
  sStack_96 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  sStack_94 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  sStack_92 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  sStack_90 = (short)extraout_XMM0_Qb;
  sStack_8e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  sStack_8c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  sStack_8a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  local_d8._2_2_ = sStack_96 + 0x10;
  local_d8._0_2_ = local_98 + 0x10;
  local_d8._4_2_ = sStack_94 + 0x10;
  local_d8._6_2_ = sStack_92 + 0x10;
  local_d8._8_2_ = sStack_90 + 0x10;
  local_d8._10_2_ = sStack_8e + 0x10;
  local_d8._12_2_ = sStack_8c + 0x10;
  local_d8._14_2_ = sStack_8a + 0x10;
  local_78 = local_d8._0_8_;
  uStack_70 = local_d8._8_8_;
  local_7c = 5;
  auVar2._8_8_ = local_d8._8_8_;
  auVar2._0_8_ = local_d8._0_8_;
  auVar2 = psraw(auVar2,ZEXT416(5));
  local_d8._0_8_ = auVar2._0_8_;
  local_d8._8_8_ = auVar2._8_8_;
  local_58 = local_d8._0_8_;
  uVar1 = local_58;
  uStack_50 = local_d8._8_8_;
  local_68 = local_d8._0_8_;
  uStack_60 = local_d8._8_8_;
  local_58._0_1_ = auVar2[0];
  local_58._1_1_ = auVar2[1];
  local_58._2_1_ = auVar2[2];
  local_58._3_1_ = auVar2[3];
  local_58._4_1_ = auVar2[4];
  local_58._5_1_ = auVar2[5];
  local_58._6_1_ = auVar2[6];
  local_58._7_1_ = auVar2[7];
  local_d8[1] = (undefined1)local_58;
  local_d8[0] = (undefined1)local_58;
  local_d8[2] = local_58._1_1_;
  local_d8[3] = local_58._1_1_;
  local_d8[4] = local_58._2_1_;
  local_d8[5] = local_58._2_1_;
  local_d8[6] = local_58._3_1_;
  local_d8[7] = local_58._3_1_;
  local_d8[8] = local_58._4_1_;
  local_d8[9] = local_58._4_1_;
  local_d8[10] = local_58._5_1_;
  local_d8[0xb] = local_58._5_1_;
  local_d8[0xc] = local_58._6_1_;
  local_d8[0xd] = local_58._6_1_;
  local_d8[0xe] = local_58._7_1_;
  local_d8[0xf] = local_58._7_1_;
  local_d8 = pshuflw(local_d8,local_d8,0);
  local_38 = local_d8._0_8_;
  uStack_30 = local_d8._8_8_;
  local_48 = local_d8._0_8_;
  uStack_40 = local_d8._8_8_;
  local_f8 = local_d8._0_8_;
  lStack_f0 = local_d8._0_8_;
  local_a8 = local_e8;
  uStack_a0 = uStack_e0;
  local_58 = uVar1;
  local_28 = local_e8;
  uStack_20 = uStack_e0;
  dc_store_64xh((__m128i *)&local_f8,0x20,local_b0,local_b8);
  return;
}

Assistant:

void aom_dc_left_predictor_64x32_sse2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above,
                                      const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_32_sse2(left);
  const __m128i sixteen = _mm_set1_epi16(16);
  sum_left = _mm_add_epi16(sum_left, sixteen);
  sum_left = _mm_srai_epi16(sum_left, 5);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_64xh(&row, 32, dst, stride);
}